

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
SeveralSumsInOne_CanSumSeveral_Test::~SeveralSumsInOne_CanSumSeveral_Test
          (SeveralSumsInOne_CanSumSeveral_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SeveralSumsInOne, CanSumSeveral)
{
    using ::testing::AtLeast;
    EXPECT_GLOBAL_CALL(sum2, sum2(1, 2)).Times(1);
    sum2(1, 2);
    EXPECT_GLOBAL_CALL(sum2, sum2(1, 2)).Times(AtLeast(1));
    sum2(1, 2);

    EXPECT_GLOBAL_CALL(sum3, sum3(1, 2, 3)).Times(2);
    sum3(1, 2, 3);
    sum3(1, 2, 3);
}